

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convert.c
# Opt level: O1

void abgr_f32_to_abgr_8888
               (void *src,int src_pitch,void *dst,int dst_pitch,int sx,int sy,int dx,int dy,
               int width,int height)

{
  uint *puVar1;
  uint *puVar2;
  float *pfVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  
  if (0 < height) {
    puVar2 = (uint *)((long)dst + (long)dx * 4 + (long)(dy * dst_pitch));
    pfVar3 = (float *)((long)src + (long)(sy * src_pitch) + (long)sx * 0x10);
    iVar4 = dst_pitch + 3;
    if (-1 < dst_pitch) {
      iVar4 = dst_pitch;
    }
    iVar5 = src_pitch + 0xf;
    if (-1 < src_pitch) {
      iVar5 = src_pitch;
    }
    iVar6 = 0;
    do {
      if (0 < width) {
        puVar1 = puVar2 + width;
        do {
          *puVar2 = (uint)(long)(*pfVar3 * 255.0) | (int)(long)(pfVar3[1] * 255.0) << 8 |
                    (int)(long)(pfVar3[2] * 255.0) << 0x10 | (int)(long)(pfVar3[3] * 255.0) << 0x18;
          puVar2 = puVar2 + 1;
          pfVar3 = pfVar3 + 4;
        } while (puVar2 < puVar1);
      }
      pfVar3 = pfVar3 + (long)((iVar5 >> 4) - width) * 4;
      puVar2 = puVar2 + ((iVar4 >> 2) - width);
      iVar6 = iVar6 + 1;
    } while (iVar6 != height);
  }
  return;
}

Assistant:

static void abgr_f32_to_abgr_8888(const void *src, int src_pitch,
   void *dst, int dst_pitch,
   int sx, int sy, int dx, int dy, int width, int height)
{
   int y;
   const ALLEGRO_COLOR *src_ptr = (const ALLEGRO_COLOR *)((const char *)src + sy * src_pitch);
   uint32_t *dst_ptr = (void *)((char *)dst + dy * dst_pitch);
   int src_gap = src_pitch / 16 - width;
   int dst_gap = dst_pitch / 4 - width;
   src_ptr += sx;
   dst_ptr += dx;
   for (y = 0; y < height; y++) {
      uint32_t *dst_end = dst_ptr + width;
      while (dst_ptr < dst_end) {
         *dst_ptr = ALLEGRO_CONVERT_ABGR_F32_TO_ABGR_8888(*src_ptr);
         dst_ptr++;
         src_ptr++;
      }
      src_ptr += src_gap;
      dst_ptr += dst_gap;
   }
}